

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printFileAndLineForFailure(TestOutput *this,TestFailure *failure)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleString local_48 [2];
  SimpleString local_28;
  TestFailure *local_18;
  TestFailure *failure_local;
  TestOutput *this_local;
  
  local_18 = failure;
  failure_local = (TestFailure *)this;
  (*failure->_vptr_TestFailure[2])(&local_28);
  iVar1 = (*local_18->_vptr_TestFailure[5])();
  printErrorInFileOnLineFormattedForWorkingEnvironment(this,&local_28,CONCAT44(extraout_var,iVar1));
  SimpleString::~SimpleString(&local_28);
  (*local_18->_vptr_TestFailure[3])();
  printFailureInTest(this,local_48);
  SimpleString::~SimpleString(local_48);
  return;
}

Assistant:

void TestOutput::printFileAndLineForFailure(const TestFailure& failure)
{
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getFileName(), failure.getFailureLineNumber());
    printFailureInTest(failure.getTestName());
}